

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O0

int __thiscall smf::MidiEventList::push_back_no_copy(MidiEventList *this,MidiEvent *event)

{
  size_type sVar1;
  MidiEvent *local_18;
  MidiEvent *event_local;
  MidiEventList *this_local;
  
  local_18 = event;
  event_local = (MidiEvent *)this;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::push_back(&this->list,&local_18)
  ;
  sVar1 = std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::size(&this->list);
  return (int)sVar1 + -1;
}

Assistant:

int MidiEventList::push_back_no_copy(MidiEvent* event) {
	list.push_back(event);
	return (int)list.size()-1;
}